

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O0

size_t rtosc::helpers::get_value_from_runtime
                 (void *runtime,Port *port,size_t loc_size,char *loc,char *portname_from_base,
                 size_t buffersize,size_t max_args,rtosc_arg_val_t *arg_vals,
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *scratch_bufs)

{
  long lVar1;
  Port *pPVar2;
  size_t sVar3;
  Port *pPVar4;
  size_t sStack_130;
  undefined1 local_128 [24];
  char **local_110;
  Port *local_108;
  long local_f0;
  char *start_of_port_in_msg;
  Capture d;
  size_t addr_len;
  unsigned_long __vla_expr0;
  size_t buffersize_local;
  char *portname_from_base_local;
  char *loc_local;
  size_t loc_size_local;
  Port *port_local;
  void *runtime_local;
  
  lVar1 = -(buffersize + 0xf & 0xfffffffffffffff0);
  pPVar4 = (Port *)(local_128 + lVar1);
  local_108 = pPVar4;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118dd6;
  fast_strcpy(*(char **)(local_128 + lVar1 + 8),pPVar4->name,*(size_t *)((long)&sStack_130 + lVar1))
  ;
  pPVar2 = local_108;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118de2;
  d.scratch_bufs =
       (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        *)strlen((char *)pPVar2);
  local_110 = &start_of_port_in_msg;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118e05;
  Capture::Capture(*(Capture **)((long)&local_110 + lVar1),*(size_t *)(local_128 + lVar1 + 0x10),
                   *(rtosc_arg_val_t **)(local_128 + lVar1 + 8),
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)pPVar4->name);
  pPVar2 = local_108;
  d.super_RtData.obj._0_4_ = 0;
  *(undefined8 *)(d.scratch_bufs + (long)local_108) = 0;
  *(char *)((long)&local_108->name + ((ulong)d.scratch_bufs & 0xfffffffffffffffc) + 4) = ',';
  d.super_RtData._vptr_RtData = (_func_int **)loc;
  d.super_RtData.loc = (char *)loc_size;
  d.super_RtData.loc_size = (size_t)runtime;
  d.super_RtData._32_8_ = port;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118e60;
  sVar3 = strlen((char *)pPVar2);
  local_128._16_8_ = (long)&local_108->name + sVar3;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118e7d;
  sVar3 = strlen(portname_from_base);
  local_f0 = local_128._16_8_ - sVar3;
  d.super_RtData.port = local_108;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118eba;
  std::function<void_(const_char_*,_rtosc::RtData_&)>::operator()
            (*(function<void_(const_char_*,_rtosc::RtData_&)> **)((long)&local_110 + lVar1),
             *(char **)(local_128 + lVar1 + 0x10),*(RtData **)(local_128 + lVar1 + 8));
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118ec8;
  local_128._12_4_ = Capture::size((Capture *)&start_of_port_in_msg);
  local_128._0_8_ = (long)(int)local_128._12_4_;
  *(undefined8 *)((long)&sStack_130 + lVar1) = 0x118eeb;
  Capture::~Capture(*(Capture **)((long)&sStack_130 + lVar1));
  return local_128._0_8_;
}

Assistant:

size_t get_value_from_runtime(void* runtime, const Port& port,
                              size_t loc_size, char* loc,
                              const char* portname_from_base,
                              std::size_t buffersize,
                              std::size_t max_args, rtosc_arg_val_t* arg_vals,
                              std::vector<std::vector<char> >* scratch_bufs)
{
    assert(portname_from_base);

    STACKALLOC(char, buffer_with_port, buffersize);
    fast_strcpy(buffer_with_port, loc, buffersize);
    std::size_t addr_len = strlen(buffer_with_port);

    Capture d(max_args, arg_vals, scratch_bufs);
    d.obj = runtime;
    d.loc_size = loc_size;
    d.loc = loc;
    d.port = &port;
    d.matches = 0;
    assert(*loc == '/');

    // does the message at least fit the arguments?
    assert(buffersize - addr_len >= 8);
    // append type
    memset(buffer_with_port + addr_len, 0, 8); // cover string end and arguments
    buffer_with_port[addr_len + (4-addr_len%4)] = ',';

    // TODO? code duplication

    // buffer_with_port is a message in this call:
    const char* start_of_port_in_msg = buffer_with_port + strlen(buffer_with_port) - strlen(portname_from_base);
    assert(start_of_port_in_msg);
    assert(!strcmp(start_of_port_in_msg, portname_from_base));
    d.message = buffer_with_port;
    port.cb(start_of_port_in_msg, d);

    assert(d.size() >= 0);
    return d.size();
}